

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O3

void __thiscall
iqxmlrpc::Server::Impl::Impl
          (Impl *this,Inet_addr *addr,Accepted_conn_factory *cf,Executor_factory_base *ef)

{
  sp_counted_base *psVar1;
  int iVar2;
  undefined4 extraout_var;
  Reactor_interrupter *this_00;
  
  this->exec_factory = ef;
  (this->bind_addr)._vptr_Inet_addr = (_func_int **)&PTR__Inet_addr_00187f48;
  (this->bind_addr).impl_.px = (addr->impl_).px;
  psVar1 = (addr->impl_).pn.pi_;
  (this->bind_addr).impl_.pn.pi_ = psVar1;
  if (psVar1 != (sp_counted_base *)0x0) {
    LOCK();
    psVar1->use_count_ = psVar1->use_count_ + 1;
    UNLOCK();
  }
  iVar2 = (*ef->_vptr_Executor_factory_base[3])(ef);
  (this->reactor)._M_ptr = (Reactor_base *)CONCAT44(extraout_var,iVar2);
  this_00 = (Reactor_interrupter *)operator_new(8);
  iqnet::Reactor_interrupter::Reactor_interrupter
            (this_00,(Reactor_base *)CONCAT44(extraout_var,iVar2));
  (this->interrupter)._M_ptr = this_00;
  (this->conn_factory)._M_ptr = cf;
  (this->acceptor)._M_ptr = (Acceptor *)0x0;
  this->firewall = (Firewall_base *)0x0;
  this->exit_flag = false;
  this->log = (ostream *)0x0;
  this->max_req_sz = 0;
  this->ver_level = HTTP_CHECK_WEAK;
  Method_dispatcher_manager::Method_dispatcher_manager(&this->disp_manager);
  (this->interceptors)._M_ptr = (Interceptor *)0x0;
  this->auth_plugin = (Auth_Plugin_base *)0x0;
  return;
}

Assistant:

Impl(
    const iqnet::Inet_addr& addr,
    iqnet::Accepted_conn_factory* cf,
    Executor_factory_base* ef):
      exec_factory(ef),
      bind_addr(addr),
      reactor(ef->create_reactor()),
      interrupter(new iqnet::Reactor_interrupter(reactor.get())),
      conn_factory(cf),
      acceptor(0),
      firewall(0),
      exit_flag(false),
      log(0),
      max_req_sz(0),
      ver_level(http::HTTP_CHECK_WEAK),
      interceptors(0),
      auth_plugin(0)
  {
  }